

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O1

Instr * __thiscall LowererMD::Simd128LowerInt32x4FromFloat32x4(LowererMD *this,Instr *instr)

{
  Opnd *src1Opnd;
  Opnd *src2Opnd;
  Instr *this_00;
  Instr *pIVar1;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  LabelInstr *branchTarget;
  RegOpnd *dstOpnd;
  RegOpnd *dstOpnd_00;
  RegOpnd *dstOpnd_01;
  RegOpnd *dstOpnd_02;
  intptr_t iVar6;
  MemRefOpnd *pMVar7;
  Instr *pIVar8;
  RegOpnd *pRVar9;
  IntConstOpnd *pIVar10;
  BranchInstr *pBVar11;
  JITTimeFunctionBody *this_01;
  byte bVar12;
  
  src1Opnd = instr->m_dst;
  src2Opnd = instr->m_src1;
  if (src2Opnd == (Opnd *)0x0 || src1Opnd == (Opnd *)0x0) {
LAB_0067a486:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x8f7,
                       "(dst != nullptr && src != nullptr && dst->IsSimd128() && src->IsSimd128())",
                       "dst != nullptr && src != nullptr && dst->IsSimd128() && src->IsSimd128()");
    if (!bVar4) goto LAB_0067acd5;
    *puVar5 = 0;
  }
  else {
    bVar4 = IRType_IsSimd128(src1Opnd->m_type);
    if (!bVar4) goto LAB_0067a486;
    bVar4 = IRType_IsSimd128(src2Opnd->m_type);
    if (!bVar4) goto LAB_0067a486;
  }
  instr->m_opcode = CVTTPS2DQ;
  this_00 = instr->m_next;
  pIVar1 = instr->m_prev;
  branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
  dstOpnd = IR::RegOpnd::New(TyInt32,this->m_func);
  dstOpnd_00 = IR::RegOpnd::New(TyInt32,this->m_func);
  dstOpnd_01 = IR::RegOpnd::New(TySimd128I4,this->m_func);
  dstOpnd_02 = IR::RegOpnd::New(TySimd128I4,this->m_func);
  iVar6 = ThreadContextInfo::GetX86NegMaskF4Addr(this->m_func->m_threadContextInfo);
  pMVar7 = IR::MemRefOpnd::New(iVar6,TySimd128I4,this->m_func,AddrOpndKindDynamicMisc);
  pIVar8 = IR::Instr::New(MOVAPS,&dstOpnd_02->super_Opnd,&pMVar7->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(this_00,pIVar8);
  Legalize<false>(pIVar8,false);
  pIVar8 = IR::Instr::New(PCMPEQD,&dstOpnd_01->super_Opnd,src1Opnd,&dstOpnd_02->super_Opnd,
                          this->m_func);
  IR::Instr::InsertBefore(this_00,pIVar8);
  Legalize<false>(pIVar8,false);
  pIVar8 = IR::Instr::New(MOVMSKPS,&dstOpnd->super_Opnd,&dstOpnd_01->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(this_00,pIVar8);
  pIVar8 = IR::Instr::New(CMP,this->m_func);
  if (pIVar8->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_0067acd5;
    *puVar5 = 0;
  }
  pFVar2 = pIVar8->m_func;
  if ((dstOpnd->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) goto LAB_0067acd5;
    *puVar5 = 0;
  }
  bVar12 = (dstOpnd->super_Opnd).field_0xb;
  pRVar9 = dstOpnd;
  if ((bVar12 & 2) != 0) {
    pRVar9 = (RegOpnd *)IR::Opnd::Copy(&dstOpnd->super_Opnd,pFVar2);
    bVar12 = (pRVar9->super_Opnd).field_0xb;
  }
  (pRVar9->super_Opnd).field_0xb = bVar12 | 2;
  pIVar8->m_src1 = &pRVar9->super_Opnd;
  pIVar10 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
  if (pIVar8->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_0067acd5;
    *puVar5 = 0;
  }
  pFVar2 = pIVar8->m_func;
  if ((pIVar10->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) goto LAB_0067acd5;
    *puVar5 = 0;
  }
  bVar12 = (pIVar10->super_Opnd).field_0xb;
  if ((bVar12 & 2) != 0) {
    pIVar10 = (IntConstOpnd *)IR::Opnd::Copy(&pIVar10->super_Opnd,pFVar2);
    bVar12 = (pIVar10->super_Opnd).field_0xb;
  }
  (pIVar10->super_Opnd).field_0xb = bVar12 | 2;
  pIVar8->m_src2 = &pIVar10->super_Opnd;
  IR::Instr::InsertBefore(this_00,pIVar8);
  pBVar11 = IR::BranchInstr::New(JEQ,branchTarget,this->m_func);
  IR::Instr::InsertBefore(this_00,&pBVar11->super_Instr);
  iVar6 = ThreadContextInfo::GetX86TwoPower31F4Addr(this->m_func->m_threadContextInfo);
  pMVar7 = IR::MemRefOpnd::New(iVar6,TySimd128I4,this->m_func,AddrOpndKindDynamicMisc);
  pIVar8 = IR::Instr::New(MOVAPS,&dstOpnd_02->super_Opnd,&pMVar7->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(this_00,pIVar8);
  Legalize<false>(pIVar8,false);
  pIVar8 = IR::Instr::New(CMPLEPS,&dstOpnd_01->super_Opnd,&dstOpnd_02->super_Opnd,src2Opnd,
                          this->m_func);
  IR::Instr::InsertBefore(this_00,pIVar8);
  Legalize<false>(pIVar8,false);
  pIVar8 = IR::Instr::New(MOVMSKPS,&dstOpnd->super_Opnd,&dstOpnd_01->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(this_00,pIVar8);
  iVar6 = ThreadContextInfo::GetX86NegTwoPower31F4Addr(this->m_func->m_threadContextInfo);
  pMVar7 = IR::MemRefOpnd::New(iVar6,TySimd128I4,this->m_func,AddrOpndKindDynamicMisc);
  pIVar8 = IR::Instr::New(MOVAPS,&dstOpnd_02->super_Opnd,&pMVar7->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(this_00,pIVar8);
  Legalize<false>(pIVar8,false);
  pIVar8 = IR::Instr::New(CMPLTPS,&dstOpnd_01->super_Opnd,src2Opnd,&dstOpnd_02->super_Opnd,
                          this->m_func);
  IR::Instr::InsertBefore(this_00,pIVar8);
  Legalize<false>(pIVar8,false);
  pIVar8 = IR::Instr::New(MOVMSKPS,&dstOpnd_00->super_Opnd,&dstOpnd_01->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(this_00,pIVar8);
  pIVar8 = IR::Instr::New(OR,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,&dstOpnd_00->super_Opnd,
                          this->m_func);
  IR::Instr::InsertBefore(this_00,pIVar8);
  this_01 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar4 = JITTimeFunctionBody::IsWasmFunction(this_01);
  if (bVar4) {
    pIVar8 = IR::Instr::New(CMPEQPS,&dstOpnd_01->super_Opnd,src2Opnd,src2Opnd,this->m_func);
    IR::Instr::InsertBefore(this_00,pIVar8);
    Legalize<false>(pIVar8,false);
    pIVar8 = IR::Instr::New(MOVMSKPS,&dstOpnd_00->super_Opnd,&dstOpnd_01->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(this_00,pIVar8);
    pIVar8 = IR::Instr::New(NOT,&dstOpnd_00->super_Opnd,&dstOpnd_00->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(this_00,pIVar8);
    pIVar10 = IR::IntConstOpnd::New(0xf,TyInt32,this->m_func,false);
    pIVar8 = IR::Instr::New(AND,&dstOpnd_00->super_Opnd,&dstOpnd_00->super_Opnd,&pIVar10->super_Opnd
                            ,this->m_func);
    IR::Instr::InsertBefore(this_00,pIVar8);
    Legalize<false>(pIVar8,false);
    pIVar8 = IR::Instr::New(OR,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,&dstOpnd_00->super_Opnd,
                            this->m_func);
    IR::Instr::InsertBefore(this_00,pIVar8);
  }
  pIVar8 = IR::Instr::New(CMP,this->m_func);
  if (pIVar8->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_0067acd5;
    *puVar5 = 0;
  }
  pFVar2 = pIVar8->m_func;
  if ((dstOpnd->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) goto LAB_0067acd5;
    *puVar5 = 0;
  }
  bVar12 = (dstOpnd->super_Opnd).field_0xb;
  if ((bVar12 & 2) != 0) {
    dstOpnd = (RegOpnd *)IR::Opnd::Copy(&dstOpnd->super_Opnd,pFVar2);
    bVar12 = (dstOpnd->super_Opnd).field_0xb;
  }
  (dstOpnd->super_Opnd).field_0xb = bVar12 | 2;
  pIVar8->m_src1 = &dstOpnd->super_Opnd;
  pIVar10 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
  if (pIVar8->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_0067acd5;
    *puVar5 = 0;
  }
  pFVar2 = pIVar8->m_func;
  if ((pIVar10->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) {
LAB_0067acd5:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  bVar12 = (pIVar10->super_Opnd).field_0xb;
  if ((bVar12 & 2) != 0) {
    pIVar10 = (IntConstOpnd *)IR::Opnd::Copy(&pIVar10->super_Opnd,pFVar2);
    bVar12 = (pIVar10->super_Opnd).field_0xb;
  }
  (pIVar10->super_Opnd).field_0xb = bVar12 | 2;
  pIVar8->m_src2 = &pIVar10->super_Opnd;
  IR::Instr::InsertBefore(this_00,pIVar8);
  pBVar11 = IR::BranchInstr::New(JEQ,branchTarget,this->m_func);
  IR::Instr::InsertBefore(this_00,&pBVar11->super_Instr);
  Lowerer::GenerateRuntimeError(this->m_lowerer,this_00,-0x7ff5ebf6,HelperOp_RuntimeRangeError);
  IR::Instr::InsertBefore(this_00,&branchTarget->super_Instr);
  return pIVar1;
}

Assistant:

IR::Instr* LowererMD::Simd128LowerInt32x4FromFloat32x4(IR::Instr *instr)
{
    IR::Opnd *dst, *src, *tmp, *tmp2, *mask1, *mask2;
    IR::Instr *insertInstr, *pInstr, *newInstr;
    IR::LabelInstr *doneLabel;
    dst = instr->GetDst();
    src = instr->GetSrc1();
    Assert(dst != nullptr && src != nullptr && dst->IsSimd128() && src->IsSimd128());

    // CVTTPS2DQ dst, src
    instr->m_opcode = Js::OpCode::CVTTPS2DQ;
    insertInstr = instr->m_next;
    pInstr = instr->m_prev;
    doneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    mask1 = IR::RegOpnd::New(TyInt32, m_func);
    mask2 = IR::RegOpnd::New(TyInt32, m_func);

    // bound checks
    // check if any value is potentially out of range (0x80000000 in output)
    // PCMPEQD tmp, dst, X86_NEG_MASK (0x80000000)
    // MOVMSKPS mask1, tmp
    // CMP mask1, 0
    // JNE $doneLabel
    tmp = IR::RegOpnd::New(TySimd128I4, m_func);
    tmp2 = IR::RegOpnd::New(TySimd128I4, m_func);
    newInstr = IR::Instr::New(Js::OpCode::MOVAPS, tmp2, IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86NegMaskF4Addr(), TySimd128I4, m_func), m_func);
    insertInstr->InsertBefore(newInstr);
    Legalize(newInstr);
    newInstr = IR::Instr::New(Js::OpCode::PCMPEQD, tmp, dst, tmp2, m_func);
    insertInstr->InsertBefore(newInstr);
    Legalize(newInstr);
    insertInstr->InsertBefore(IR::Instr::New(Js::OpCode::MOVMSKPS, mask1, tmp, m_func));
    newInstr = IR::Instr::New(Js::OpCode::CMP, m_func);
    newInstr->SetSrc1(mask1);
    newInstr->SetSrc2(IR::IntConstOpnd::New(0, TyInt32, m_func));
    insertInstr->InsertBefore(newInstr);
    insertInstr->InsertBefore(IR::BranchInstr::New(Js::OpCode::JEQ, doneLabel, m_func));

    // we have potential out of bound. check bounds
    // MOVAPS tmp2, X86_TWO_31_F4 (0x4f000000)
    // CMPLEPS tmp, tmp2, src
    // MOVMSKPS mask1, tmp
    // MOVAPS tmp2, X86_NEG_TWO_31_F4 (0xcf000000)
    // CMPLTPS tmp, src, tmp2
    // MOVMSKPS mask2, tmp
    // OR mask1, mask1, mask2
    // check for NaNs
    // CMPEQPS tmp, src
    // MOVMSKPS mask2, tmp
    // NOT mask2
    // AND mask2, 0x00000F
    // OR mask1, mask2
    //
    // CMP mask1, 0
    // JEQ $doneLabel
    newInstr = IR::Instr::New(Js::OpCode::MOVAPS, tmp2, IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86TwoPower31F4Addr(), TySimd128I4, m_func), m_func);
    insertInstr->InsertBefore(newInstr);
    Legalize(newInstr);
    newInstr = IR::Instr::New(Js::OpCode::CMPLEPS, tmp, tmp2, src, m_func);
    insertInstr->InsertBefore(newInstr);
    Legalize(newInstr);
    insertInstr->InsertBefore(IR::Instr::New(Js::OpCode::MOVMSKPS, mask1, tmp, m_func));

    newInstr = IR::Instr::New(Js::OpCode::MOVAPS, tmp2, IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86NegTwoPower31F4Addr(), TySimd128I4, m_func), m_func);
    insertInstr->InsertBefore(newInstr);
    Legalize(newInstr);
    newInstr = IR::Instr::New(Js::OpCode::CMPLTPS, tmp, src, tmp2, m_func);
    insertInstr->InsertBefore(newInstr);
    Legalize(newInstr);

    insertInstr->InsertBefore(IR::Instr::New(Js::OpCode::MOVMSKPS, mask2, tmp, m_func));

    insertInstr->InsertBefore(IR::Instr::New(Js::OpCode::OR, mask1, mask1, mask2, m_func));

#ifdef ENABLE_WASM_SIMD
    if (m_func->GetJITFunctionBody()->IsWasmFunction())
    {
        newInstr = IR::Instr::New(Js::OpCode::CMPEQPS, tmp, src, src, m_func);
        insertInstr->InsertBefore(newInstr);
        Legalize(newInstr);
        insertInstr->InsertBefore(IR::Instr::New(Js::OpCode::MOVMSKPS, mask2, tmp, m_func));
        insertInstr->InsertBefore(IR::Instr::New(Js::OpCode::NOT, mask2, mask2, m_func));
        newInstr = IR::Instr::New(Js::OpCode::AND, mask2, mask2, IR::IntConstOpnd::New(0x00000F, TyInt32, m_func), m_func);
        insertInstr->InsertBefore(newInstr);
        Legalize(newInstr);
        insertInstr->InsertBefore(IR::Instr::New(Js::OpCode::OR, mask1, mask1, mask2, m_func));
    }
#endif

    newInstr = IR::Instr::New(Js::OpCode::CMP, m_func);
    newInstr->SetSrc1(mask1);
    newInstr->SetSrc2(IR::IntConstOpnd::New(0, TyInt32, m_func));
    insertInstr->InsertBefore(newInstr);
    insertInstr->InsertBefore(IR::BranchInstr::New(Js::OpCode::JEQ, doneLabel, m_func));

    // throw range error
    m_lowerer->GenerateRuntimeError(insertInstr, JSERR_ArgumentOutOfRange, IR::HelperOp_RuntimeRangeError);

    insertInstr->InsertBefore(doneLabel);

    return pInstr;
}